

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantsTests.cpp
# Opt level: O2

void __thiscall ConstantsTest_Values_Test<double>::TestBody(ConstantsTest_Values_Test<double> *this)

{
  char *pcVar1;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400921fb5443d6f4
  ;
  local_30.data_ = (AssertHelperData *)0x400921fb5443d6f4;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::pi)",
             "Constants<TypeParam>::pi()",(double *)&local_28,(double *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x13,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_28.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x421beb9bf3a00000;
    local_30.data_ = (AssertHelperData *)0x421beb9bf3a00000;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::c)",
               "Constants<TypeParam>::c()",(double *)&local_28,(double *)&local_30);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                 ,0x14,pcVar1);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_28.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0x421beb9bf3a00000;
      local_30.data_ = (AssertHelperData *)0x421beb9bf3a00000;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::lightVelocity)",
                 "Constants<TypeParam>::lightVelocity()",(double *)&local_28,(double *)&local_30);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_28);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                   ,0x15,pcVar1);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_28.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             0xbe0080f172b1f37d;
        local_30.data_ = (AssertHelperData *)0xbe0080f172b1f37d;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::electronCharge)",
                   "Constants<TypeParam>::electronCharge()",(double *)&local_28,(double *)&local_30)
        ;
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_28);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                     ,0x16,pcVar1);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_28.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x3a520b016873bbd3;
          local_30.data_ = (AssertHelperData *)0x3a520b016873bbd3;
          testing::internal::CmpHelperEQ<double,double>
                    ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::electronMass)",
                     "Constants<TypeParam>::electronMass()",(double *)&local_28,(double *)&local_30)
          ;
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_28);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_30,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                       ,0x17,pcVar1);
            testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_28.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0x3b002d36c08bec5d;
            local_30.data_ = (AssertHelperData *)0x3b002d36c08bec5d;
            testing::internal::CmpHelperEQ<double,double>
                      ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::protonMass)",
                       "Constants<TypeParam>::protonMass()",(double *)&local_28,(double *)&local_30)
            ;
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_28);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                         ,0x18,pcVar1);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              local_28.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   0x3a54e3504ec0acb9;
              local_30.data_ = (AssertHelperData *)0x3a54e3504ec0acb9;
              testing::internal::CmpHelperEQ<double,double>
                        ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::planck)",
                         "Constants<TypeParam>::planck()",(double *)&local_28,(double *)&local_30);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_28);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_30,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                           ,0x19,pcVar1);
                testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                local_28.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0x3d7c2f8fd0fd919b;
                local_30.data_ = (AssertHelperData *)0x3d7c2f8fd0fd919b;
                testing::internal::CmpHelperEQ<double,double>
                          ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::eV)",
                           "Constants<TypeParam>::eV()",(double *)&local_28,(double *)&local_30);
                if (gtest_ar.success_ != false) {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  local_28.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x3ebae14bc36b1270;
                  local_30.data_ = (AssertHelperData *)0x3ebae14bc36b1270;
                  testing::internal::CmpHelperEQ<double,double>
                            ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::meV)",
                             "Constants<TypeParam>::meV()",(double *)&local_28,(double *)&local_30);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_28);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar1 = "";
                    }
                    else {
                      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_30,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                               ,0x1b,pcVar1);
                    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
                    testing::internal::AssertHelper::~AssertHelper(&local_30);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&local_28);
                  }
                  goto LAB_001852ea;
                }
                testing::Message::Message((Message *)&local_28);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_30,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                           ,0x1a,pcVar1);
                testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
LAB_001852ea:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(ConstantsTest, Values)
{
    // Check that all members of Constants<T> can be instantiated for all T in types
    // and are the same as casted corresponding values of constants namespace
    ASSERT_EQ(static_cast<TypeParam>(constants::pi), Constants<TypeParam>::pi());
    ASSERT_EQ(static_cast<TypeParam>(constants::c), Constants<TypeParam>::c());
    ASSERT_EQ(static_cast<TypeParam>(constants::lightVelocity), Constants<TypeParam>::lightVelocity());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronCharge), Constants<TypeParam>::electronCharge());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronMass), Constants<TypeParam>::electronMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::protonMass), Constants<TypeParam>::protonMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::planck), Constants<TypeParam>::planck());
    ASSERT_EQ(static_cast<TypeParam>(constants::eV), Constants<TypeParam>::eV());
    ASSERT_EQ(static_cast<TypeParam>(constants::meV), Constants<TypeParam>::meV());
}